

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.cpp
# Opt level: O2

QueryResult *
QueryResult::do_min_of_real
          (QueryResult *__return_storage_ptr__,int cutoff,
          vector<QueryResult_*,_std::allocator<QueryResult_*>_> *sources)

{
  pointer ppQVar1;
  QueryResult *this;
  bool bVar2;
  int iVar3;
  int i;
  ulong uVar4;
  pointer ppQVar5;
  vector<SortedRun_*,_std::allocator<SortedRun_*>_> nontrivial_sources;
  SortedRun local_60;
  
  nontrivial_sources.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nontrivial_sources.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nontrivial_sources.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppQVar1 = (sources->super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppQVar5 = (sources->super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppQVar5 != ppQVar1; ppQVar5 = ppQVar5 + 1
      ) {
    this = *ppQVar5;
    if (this->has_everything == true) {
      cutoff = cutoff + -1;
    }
    else {
      bVar2 = is_empty(this);
      if (!bVar2) {
        local_60.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)this;
        std::vector<SortedRun*,std::allocator<SortedRun*>>::emplace_back<SortedRun*>
                  ((vector<SortedRun*,std::allocator<SortedRun*>> *)&nontrivial_sources,
                   (SortedRun **)&local_60);
      }
    }
  }
  if (cutoff < 1) {
    (__return_storage_ptr__->results).run_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->results).run_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->results).sequence_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->results).run_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->results).sequence_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__return_storage_ptr__->results).sequence_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->has_everything = true;
  }
  else {
    iVar3 = (int)((ulong)((long)nontrivial_sources.
                                super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)nontrivial_sources.
                               super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3);
    if (iVar3 < cutoff) {
      empty();
    }
    else if (cutoff == iVar3) {
      SortedRun::SortedRun
                (&local_60,
                 *nontrivial_sources.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                  _M_impl.super__Vector_impl_data._M_start);
      QueryResult(__return_storage_ptr__,&local_60);
      SortedRun::~SortedRun(&local_60);
      for (uVar4 = 1;
          uVar4 < (ulong)((long)nontrivial_sources.
                                super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)nontrivial_sources.
                                super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
        SortedRun::do_and(&__return_storage_ptr__->results,
                          nontrivial_sources.
                          super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      }
    }
    else if (cutoff == 1) {
      SortedRun::SortedRun
                (&local_60,
                 *nontrivial_sources.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                  _M_impl.super__Vector_impl_data._M_start);
      QueryResult(__return_storage_ptr__,&local_60);
      SortedRun::~SortedRun(&local_60);
      for (uVar4 = 1;
          uVar4 < (ulong)((long)nontrivial_sources.
                                super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)nontrivial_sources.
                                super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
        SortedRun::do_or(&__return_storage_ptr__->results,
                         nontrivial_sources.
                         super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar4]);
      }
    }
    else {
      SortedRun::pick_common(&local_60,cutoff,&nontrivial_sources);
      QueryResult(__return_storage_ptr__,&local_60);
      SortedRun::~SortedRun(&local_60);
    }
  }
  std::_Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>::~_Vector_base
            (&nontrivial_sources.super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>);
  return __return_storage_ptr__;
}

Assistant:

QueryResult QueryResult::do_min_of_real(int cutoff,
                                        std::vector<QueryResult *> &sources) {
    std::vector<SortedRun *> nontrivial_sources;
    for (QueryResult *source : sources) {
        if (source->is_everything()) {
            cutoff -= 1;
        } else if (!source->is_empty()) {
            nontrivial_sources.push_back(&source->vector());
        }
    }

    // '0 of (...)' should match everything.
    if (cutoff <= 0) {
        return QueryResult::everything();
    }

    // Short circuit when cutoff is too big.
    // This may happen when there are empty results in sources.
    if (cutoff > static_cast<int>(nontrivial_sources.size())) {
        return QueryResult::empty();
    }

    // Special case optimisation - reduction to AND.
    if (cutoff == static_cast<int>(nontrivial_sources.size())) {
        QueryResult out{nontrivial_sources[0]->clone()};
        for (int i = 1; i < nontrivial_sources.size(); i++) {
            out.results.do_and(*nontrivial_sources[i]);
        }
        return out;
    }

    // Special case optimisation - reduction to OR.
    if (cutoff == 1) {
        QueryResult out{nontrivial_sources[0]->clone()};
        for (int i = 1; i < nontrivial_sources.size(); i++) {
            out.results.do_or(*nontrivial_sources[i]);
        }
        return out;
    }

    return QueryResult(SortedRun::pick_common(cutoff, nontrivial_sources));
}